

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  long lVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  parasail_result_t *ppVar16;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *__dest;
  __m128i *__dest_00;
  __m128i *__dest_01;
  __m128i *__dest_02;
  __m128i *ptr;
  __m128i *ptr_00;
  size_t __n;
  ulong uVar17;
  int iVar18;
  size_t len;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  int iVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  short sVar32;
  undefined4 uVar34;
  undefined4 uVar35;
  short sVar45;
  short sVar47;
  short sVar49;
  short sVar51;
  short sVar53;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar38 [16];
  short sVar43;
  short sVar55;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  ushort uVar65;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ulong uVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  short sVar88;
  ushort uVar89;
  short sVar90;
  ushort uVar91;
  short sVar92;
  ushort uVar93;
  short sVar94;
  ushort uVar95;
  short sVar96;
  ushort uVar97;
  short sVar98;
  ushort uVar99;
  short sVar100;
  ushort uVar101;
  short sVar102;
  ushort uVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  ushort uVar110;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  ushort uVar125;
  undefined1 auVar111 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  uint local_2b4;
  int local_26c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  long local_1c8;
  ushort local_1b8;
  ushort uStack_1b6;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  short local_a8;
  short sStack_a6;
  undefined1 local_98 [16];
  short sVar33;
  short sVar44;
  short sVar46;
  short sVar48;
  short sVar50;
  short sVar52;
  short sVar54;
  short sVar56;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_table_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_stats_table_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_table_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar27 = profile->s1Len;
        uVar15 = (ulong)uVar27;
        if ((int)uVar27 < 1) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_1();
        }
        else {
          uVar26 = uVar15 + 7;
          pvVar6 = (profile->profile16).matches;
          pvVar7 = (profile->profile16).similar;
          iVar12 = -open;
          iVar18 = ppVar5->min;
          iVar23 = -iVar18;
          if (iVar18 != iVar12 && SBORROW4(iVar18,iVar12) == iVar18 + open < 0) {
            iVar23 = open;
          }
          iVar18 = ppVar5->max;
          ppVar16 = parasail_result_new_table3((uint)uVar26 & 0x7ffffff8,s2Len);
          if (ppVar16 != (parasail_result_t *)0x0) {
            uVar28 = uVar26 >> 3;
            ppVar16->flag = ppVar16->flag | 0x8230404;
            b = parasail_memalign___m128i(0x10,uVar28);
            b_00 = parasail_memalign___m128i(0x10,uVar28);
            b_01 = parasail_memalign___m128i(0x10,uVar28);
            b_02 = parasail_memalign___m128i(0x10,uVar28);
            b_03 = parasail_memalign___m128i(0x10,uVar28);
            b_04 = parasail_memalign___m128i(0x10,uVar28);
            b_05 = parasail_memalign___m128i(0x10,uVar28);
            b_06 = parasail_memalign___m128i(0x10,uVar28);
            __dest = parasail_memalign___m128i(0x10,uVar28);
            __dest_00 = parasail_memalign___m128i(0x10,uVar28);
            __dest_01 = parasail_memalign___m128i(0x10,uVar28);
            __dest_02 = parasail_memalign___m128i(0x10,uVar28);
            ptr = parasail_memalign___m128i(0x10,uVar28);
            ptr_00 = parasail_memalign___m128i(0x10,uVar28);
            auVar36._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar36._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar66._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar66._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
            auVar36 = packssdw(auVar36,auVar66);
            auVar37._0_8_ = -(ulong)(b_03 == (__m128i *)0x0);
            auVar37._8_8_ = -(ulong)(b_04 == (__m128i *)0x0);
            auVar38._0_8_ = -(ulong)(b_05 == (__m128i *)0x0);
            auVar38._8_8_ = -(ulong)(b_06 == (__m128i *)0x0);
            auVar66 = packssdw(auVar37,auVar38);
            auVar36 = packssdw(auVar36,auVar66);
            if ((((((((((((((((auVar36 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar36 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar36 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar36 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar36 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar36 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar36 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar36 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar36 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar36 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar36 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar36 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar36[0xf] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (__dest == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_02 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            auVar36 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar34 = auVar36._0_4_;
            auVar36 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar35 = auVar36._0_4_;
            local_2b4 = iVar23 - 0x7fff;
            auVar66 = pshuflw(ZEXT416(local_2b4),ZEXT416(local_2b4),0);
            local_1b8 = auVar66._0_2_;
            uStack_1b6 = auVar66._2_2_;
            auVar36 = ZEXT416(CONCAT22((short)((uint)iVar12 >> 0x10),0x7ffe - (short)iVar18));
            auVar37 = pshuflw(auVar36,auVar36,0);
            local_a8 = auVar37._0_2_;
            sStack_a6 = auVar37._2_2_;
            uVar29 = (uint)uVar28;
            auVar57 = pshufb(ZEXT416(uVar29),_DAT_00906db0);
            uVar13 = local_2b4 & 0xffff;
            len = (size_t)-(gap * uVar29);
            auVar36 = pshufb(ZEXT416(-(gap * uVar29)),_DAT_00906db0);
            auVar67 = paddsw(auVar36,ZEXT416(uVar13));
            c[1] = (longlong)b_04;
            c[0] = uVar28;
            parasail_memset___m128i(b_03,c,len);
            c_00[1] = extraout_RDX;
            c_00[0] = uVar28;
            parasail_memset___m128i(b_04,c_00,len);
            c_01[1] = extraout_RDX_00;
            c_01[0] = uVar28;
            parasail_memset___m128i(b_05,c_01,len);
            c_02[1] = extraout_RDX_01;
            c_02[0] = uVar28;
            parasail_memset___m128i(b_06,c_02,len);
            c_03[1] = extraout_RDX_02;
            c_03[0] = uVar28;
            parasail_memset___m128i(b,c_03,len);
            c_04[1] = extraout_RDX_03;
            c_04[0] = uVar28;
            parasail_memset___m128i(b_00,c_04,len);
            c_05[1] = extraout_RDX_04;
            c_05[0] = uVar28;
            parasail_memset___m128i(b_01,c_05,len);
            c_06[1] = extraout_RDX_05;
            c_06[0] = uVar28;
            parasail_memset___m128i(b_02,c_06,len);
            auVar61._4_4_ = uVar35;
            auVar61._0_4_ = uVar35;
            auVar61._8_4_ = uVar35;
            auVar61._12_4_ = uVar35;
            auVar71._4_4_ = uVar34;
            auVar71._0_4_ = uVar34;
            auVar71._8_4_ = uVar34;
            auVar71._12_4_ = uVar34;
            uVar14 = uVar29 - 1;
            auVar71 = psubsw((undefined1  [16])0x0,auVar71);
            lVar19 = (ulong)uVar14 << 4;
            auVar38 = pmovsxbw(extraout_XMM0,0x101010101010101);
            uVar17 = uVar28;
            auVar36 = auVar38;
            do {
              *(undefined1 (*) [16])((long)*ptr + lVar19) = auVar71;
              *(undefined1 (*) [16])((long)*ptr_00 + lVar19) = auVar36;
              auVar71 = psubsw(auVar71,auVar61);
              auVar36 = paddsw(auVar36,auVar38);
              lVar19 = lVar19 + -0x10;
              iVar18 = (int)uVar17;
              uVar22 = iVar18 - 1;
              uVar17 = (ulong)uVar22;
            } while (uVar22 != 0 && 0 < iVar18);
            __n = uVar28 << 4;
            uVar17 = (ulong)(uint)s2Len;
            lVar20 = (ulong)(uVar29 + (uVar29 == 0)) << 4;
            lVar30 = uVar28 * uVar17;
            lVar19 = lVar30 * 4;
            lVar3 = lVar30 * 8;
            lVar8 = lVar30 * 0xc;
            lVar10 = lVar30 * 0x1c;
            lVar31 = lVar30 * 0x10;
            lVar9 = lVar30 * 0x14;
            lVar30 = lVar30 * 0x18;
            auVar109._4_2_ = local_1b8;
            auVar109._0_4_ = auVar66._0_4_;
            auVar109._6_2_ = uStack_1b6;
            auVar109._8_2_ = local_1b8;
            auVar109._10_2_ = uStack_1b6;
            auVar109._12_2_ = local_1b8;
            auVar109._14_2_ = uStack_1b6;
            local_248 = CONCAT26(sStack_a6,CONCAT24(local_a8,auVar37._0_4_));
            uStack_240 = CONCAT26(sStack_a6,CONCAT24(local_a8,auVar37._0_4_));
            local_1c8 = 0;
            uVar28 = 0;
            local_26c = 0;
            auVar111 = auVar109;
            local_98 = auVar109;
            do {
              lVar21 = (long)(int)(ppVar5->mapper[(byte)s2[uVar28]] * uVar29) * 0x10;
              uVar70 = b_06[uVar14][0];
              auVar81._0_8_ = uVar70 << 0x10;
              auVar81._8_8_ = b_06[uVar14][1] << 0x10 | uVar70 >> 0x30;
              uVar70 = b_05[uVar14][0];
              auVar82._0_8_ = uVar70 << 0x10;
              auVar82._8_8_ = b_05[uVar14][1] << 0x10 | uVar70 >> 0x30;
              uVar70 = b_04[uVar14][0];
              auVar76._0_8_ = uVar70 << 0x10;
              auVar76._8_8_ = b_04[uVar14][1] << 0x10 | uVar70 >> 0x30;
              uVar70 = b_03[uVar14][0];
              auVar78._0_8_ = uVar70 << 0x10;
              auVar78._8_8_ = b_03[uVar14][1] << 0x10 | uVar70 >> 0x30;
              lVar25 = 0;
              auVar36 = ZEXT816(0);
              local_1f8 = (undefined1  [16])0x0;
              local_208 = (undefined1  [16])0x0;
              auVar58 = (undefined1  [16])0x0;
              uVar110 = local_1b8;
              uVar112 = uStack_1b6;
              uVar114 = local_1b8;
              uVar116 = uStack_1b6;
              uVar118 = local_1b8;
              uVar120 = uStack_1b6;
              uVar122 = local_1b8;
              uVar124 = uStack_1b6;
              do {
                auVar66 = *(undefined1 (*) [16])((long)*b_03 + lVar25);
                auVar37 = *(undefined1 (*) [16])((long)*b_04 + lVar25);
                auVar87._4_4_ = uVar34;
                auVar87._0_4_ = uVar34;
                auVar87._8_4_ = uVar34;
                auVar87._12_4_ = uVar34;
                auVar104 = psubsw(auVar66,auVar87);
                auVar68._4_4_ = uVar35;
                auVar68._0_4_ = uVar35;
                auVar68._8_4_ = uVar35;
                auVar68._12_4_ = uVar35;
                auVar38 = psubsw(*(undefined1 (*) [16])((long)*b + lVar25),auVar68);
                sVar32 = auVar104._0_2_;
                sVar88 = auVar38._0_2_;
                auVar105._0_2_ = -(ushort)(sVar88 < sVar32);
                sVar43 = auVar104._2_2_;
                sVar90 = auVar38._2_2_;
                auVar105._2_2_ = -(ushort)(sVar90 < sVar43);
                sVar45 = auVar104._4_2_;
                sVar92 = auVar38._4_2_;
                auVar105._4_2_ = -(ushort)(sVar92 < sVar45);
                sVar47 = auVar104._6_2_;
                sVar94 = auVar38._6_2_;
                auVar105._6_2_ = -(ushort)(sVar94 < sVar47);
                sVar49 = auVar104._8_2_;
                sVar96 = auVar38._8_2_;
                auVar105._8_2_ = -(ushort)(sVar96 < sVar49);
                sVar51 = auVar104._10_2_;
                sVar98 = auVar38._10_2_;
                auVar105._10_2_ = -(ushort)(sVar98 < sVar51);
                sVar53 = auVar104._12_2_;
                sVar100 = auVar38._12_2_;
                sVar55 = auVar104._14_2_;
                auVar105._12_2_ = -(ushort)(sVar100 < sVar53);
                sVar102 = auVar38._14_2_;
                auVar105._14_2_ = -(ushort)(sVar102 < sVar55);
                auVar108 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar25),auVar37,auVar105);
                auVar38 = *(undefined1 (*) [16])((long)*b_05 + lVar25);
                auVar68 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar25),auVar38,auVar105);
                auVar61 = *(undefined1 (*) [16])((long)*b_06 + lVar25);
                auVar87 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar25),auVar61,auVar105);
                auVar71 = paddsw(auVar58,*(undefined1 (*) [16])((long)*ptr + lVar25));
                sVar33 = auVar71._0_2_;
                auVar39._0_2_ = -(ushort)((short)uVar110 < sVar33);
                sVar44 = auVar71._2_2_;
                auVar39._2_2_ = -(ushort)((short)uVar112 < sVar44);
                sVar46 = auVar71._4_2_;
                auVar39._4_2_ = -(ushort)((short)uVar114 < sVar46);
                sVar48 = auVar71._6_2_;
                auVar39._6_2_ = -(ushort)((short)uVar116 < sVar48);
                sVar50 = auVar71._8_2_;
                auVar39._8_2_ = -(ushort)((short)uVar118 < sVar50);
                sVar52 = auVar71._10_2_;
                auVar39._10_2_ = -(ushort)((short)uVar120 < sVar52);
                sVar54 = auVar71._12_2_;
                sVar56 = auVar71._14_2_;
                auVar39._12_2_ = -(ushort)((short)uVar122 < sVar54);
                auVar39._14_2_ = -(ushort)((short)uVar124 < sVar56);
                local_208 = pblendvb(local_208,local_178,auVar39);
                local_1f8 = pblendvb(local_1f8,local_168,auVar39);
                uVar89 = (ushort)(sVar88 < sVar32) * sVar32 | (ushort)(sVar88 >= sVar32) * sVar88;
                uVar91 = (ushort)(sVar90 < sVar43) * sVar43 | (ushort)(sVar90 >= sVar43) * sVar90;
                uVar93 = (ushort)(sVar92 < sVar45) * sVar45 | (ushort)(sVar92 >= sVar45) * sVar92;
                uVar95 = (ushort)(sVar94 < sVar47) * sVar47 | (ushort)(sVar94 >= sVar47) * sVar94;
                uVar97 = (ushort)(sVar96 < sVar49) * sVar49 | (ushort)(sVar96 >= sVar49) * sVar96;
                uVar99 = (ushort)(sVar98 < sVar51) * sVar51 | (ushort)(sVar98 >= sVar51) * sVar98;
                uVar101 = (ushort)(sVar100 < sVar53) * sVar53 |
                          (ushort)(sVar100 >= sVar53) * sVar100;
                uVar103 = (ushort)(sVar102 < sVar55) * sVar55 |
                          (ushort)(sVar102 >= sVar55) * sVar102;
                auVar105 = pmovsxbw(auVar104,0x101010101010101);
                uVar110 = (sVar33 < (short)uVar110) * uVar110 |
                          (ushort)(sVar33 >= (short)uVar110) * sVar33;
                uVar112 = (sVar44 < (short)uVar112) * uVar112 |
                          (ushort)(sVar44 >= (short)uVar112) * sVar44;
                uVar114 = (sVar46 < (short)uVar114) * uVar114 |
                          (ushort)(sVar46 >= (short)uVar114) * sVar46;
                uVar116 = (sVar48 < (short)uVar116) * uVar116 |
                          (ushort)(sVar48 >= (short)uVar116) * sVar48;
                uVar118 = (sVar50 < (short)uVar118) * uVar118 |
                          (ushort)(sVar50 >= (short)uVar118) * sVar50;
                uVar120 = (sVar52 < (short)uVar120) * uVar120 |
                          (ushort)(sVar52 >= (short)uVar120) * sVar52;
                uVar122 = (sVar54 < (short)uVar122) * uVar122 |
                          (ushort)(sVar54 >= (short)uVar122) * sVar54;
                uVar124 = (sVar56 < (short)uVar124) * uVar124 |
                          (ushort)(sVar56 >= (short)uVar124) * sVar56;
                auVar71 = paddsw(local_158,*(undefined1 (*) [16])((long)*ptr_00 + lVar25));
                auVar36 = pblendvb(auVar36,auVar71,auVar39);
                auVar78 = paddsw(auVar78,*(undefined1 (*) [16])((long)pvVar4 + lVar25 + lVar21));
                auVar76 = paddsw(auVar76,*(undefined1 (*) [16])((long)pvVar6 + lVar25 + lVar21));
                auVar71 = paddsw(auVar82,*(undefined1 (*) [16])((long)pvVar7 + lVar25 + lVar21));
                sVar32 = auVar78._0_2_;
                auVar104._0_2_ = -(ushort)(sVar32 < (short)uVar89);
                sVar33 = auVar78._2_2_;
                auVar104._2_2_ = -(ushort)(sVar33 < (short)uVar91);
                sVar43 = auVar78._4_2_;
                auVar104._4_2_ = -(ushort)(sVar43 < (short)uVar93);
                sVar44 = auVar78._6_2_;
                auVar104._6_2_ = -(ushort)(sVar44 < (short)uVar95);
                sVar45 = auVar78._8_2_;
                auVar104._8_2_ = -(ushort)(sVar45 < (short)uVar97);
                sVar46 = auVar78._10_2_;
                auVar104._10_2_ = -(ushort)(sVar46 < (short)uVar99);
                sVar47 = auVar78._12_2_;
                auVar104._12_2_ = -(ushort)(sVar47 < (short)uVar101);
                sVar48 = auVar78._14_2_;
                auVar104._14_2_ = -(ushort)(sVar48 < (short)uVar103);
                local_178 = pblendvb(auVar76,auVar108,auVar104);
                local_168 = pblendvb(auVar71,auVar68,auVar104);
                auVar58 = paddsw(auVar87,auVar105);
                auVar82 = paddsw(auVar81,auVar105);
                local_158 = pblendvb(auVar82,auVar58,auVar104);
                puVar1 = (ushort *)((long)*b + lVar25);
                *puVar1 = uVar89;
                puVar1[1] = uVar91;
                puVar1[2] = uVar93;
                puVar1[3] = uVar95;
                puVar1[4] = uVar97;
                puVar1[5] = uVar99;
                puVar1[6] = uVar101;
                puVar1[7] = uVar103;
                *(undefined1 (*) [16])((long)*b_00 + lVar25) = auVar108;
                *(undefined1 (*) [16])((long)*b_01 + lVar25) = auVar68;
                *(undefined1 (*) [16])((long)*b_02 + lVar25) = auVar58;
                uVar89 = (ushort)((short)uVar89 < sVar32) * sVar32 |
                         ((short)uVar89 >= sVar32) * uVar89;
                uVar91 = (ushort)((short)uVar91 < sVar33) * sVar33 |
                         ((short)uVar91 >= sVar33) * uVar91;
                uVar93 = (ushort)((short)uVar93 < sVar43) * sVar43 |
                         ((short)uVar93 >= sVar43) * uVar93;
                uVar95 = (ushort)((short)uVar95 < sVar44) * sVar44 |
                         ((short)uVar95 >= sVar44) * uVar95;
                auVar58._0_8_ = CONCAT26(uVar95,CONCAT24(uVar93,CONCAT22(uVar91,uVar89)));
                auVar58._8_2_ =
                     (ushort)((short)uVar97 < sVar45) * sVar45 | ((short)uVar97 >= sVar45) * uVar97;
                auVar58._10_2_ =
                     (ushort)((short)uVar99 < sVar46) * sVar46 | ((short)uVar99 >= sVar46) * uVar99;
                auVar58._12_2_ =
                     (ushort)((short)uVar101 < sVar47) * sVar47 |
                     ((short)uVar101 >= sVar47) * uVar101;
                auVar58._14_2_ =
                     (ushort)((short)uVar103 < sVar48) * sVar48 |
                     ((short)uVar103 >= sVar48) * uVar103;
                *(undefined1 (*) [16])((long)*b_03 + lVar25) = auVar78;
                *(undefined1 (*) [16])((long)*b_04 + lVar25) = auVar76;
                *(undefined1 (*) [16])((long)*b_05 + lVar25) = auVar71;
                *(undefined1 (*) [16])((long)*b_06 + lVar25) = auVar82;
                lVar25 = lVar25 + 0x10;
                auVar82 = auVar38;
                auVar76 = auVar37;
                auVar78 = auVar66;
                auVar81 = auVar61;
              } while (lVar20 != lVar25);
              lVar21 = local_178._8_8_;
              uVar70 = local_178._0_8_;
              local_178._0_8_ = uVar70 << 0x10;
              local_178._8_8_ = lVar21 << 0x10 | uVar70 >> 0x30;
              lVar21 = local_168._8_8_;
              uVar70 = local_168._0_8_;
              local_168._0_8_ = uVar70 << 0x10;
              local_168._8_8_ = lVar21 << 0x10 | uVar70 >> 0x30;
              lVar21 = local_158._8_8_;
              uVar70 = local_158._0_8_;
              local_158._0_8_ = uVar70 << 0x10;
              local_158._8_8_ = lVar21 << 0x10 | uVar70 >> 0x30;
              auVar59._0_8_ = auVar58._0_8_ << 0x10;
              auVar59._8_8_ = auVar58._8_8_ << 0x10 | (ulong)uVar95;
              auVar66 = paddsw((undefined1  [16])*ptr,auVar59);
              sVar32 = auVar66._0_2_;
              auVar108._0_2_ = -(ushort)(sVar32 < (short)uVar110);
              sVar33 = auVar66._2_2_;
              auVar108._2_2_ = -(ushort)(sVar33 < (short)uVar112);
              sVar43 = auVar66._4_2_;
              auVar108._4_2_ = -(ushort)(sVar43 < (short)uVar114);
              sVar44 = auVar66._6_2_;
              auVar108._6_2_ = -(ushort)(sVar44 < (short)uVar116);
              sVar45 = auVar66._8_2_;
              auVar108._8_2_ = -(ushort)(sVar45 < (short)uVar118);
              sVar46 = auVar66._10_2_;
              auVar108._10_2_ = -(ushort)(sVar46 < (short)uVar120);
              sVar47 = auVar66._12_2_;
              auVar108._12_2_ = -(ushort)(sVar47 < (short)uVar122);
              sVar48 = auVar66._14_2_;
              auVar108._14_2_ = -(ushort)(sVar48 < (short)uVar124);
              auVar83._0_2_ =
                   (sVar32 < (short)uVar110) * uVar110 | (ushort)(sVar32 >= (short)uVar110) * sVar32
              ;
              auVar83._2_2_ =
                   (sVar33 < (short)uVar112) * uVar112 | (ushort)(sVar33 >= (short)uVar112) * sVar33
              ;
              auVar83._4_2_ =
                   (sVar43 < (short)uVar114) * uVar114 | (ushort)(sVar43 >= (short)uVar114) * sVar43
              ;
              auVar83._6_2_ =
                   (sVar44 < (short)uVar116) * uVar116 | (ushort)(sVar44 >= (short)uVar116) * sVar44
              ;
              auVar83._8_2_ =
                   (sVar45 < (short)uVar118) * uVar118 | (ushort)(sVar45 >= (short)uVar118) * sVar45
              ;
              auVar83._10_2_ =
                   (sVar46 < (short)uVar120) * uVar120 | (ushort)(sVar46 >= (short)uVar120) * sVar46
              ;
              auVar83._12_2_ =
                   (sVar47 < (short)uVar122) * uVar122 | (ushort)(sVar47 >= (short)uVar122) * sVar47
              ;
              auVar83._14_2_ =
                   (sVar48 < (short)uVar124) * uVar124 | (ushort)(sVar48 >= (short)uVar124) * sVar48
              ;
              auVar38 = pblendvb(local_178,local_208,auVar108);
              auVar37 = pblendvb(local_168,local_1f8,auVar108);
              auVar66 = paddsw((undefined1  [16])*ptr_00,local_158);
              auVar36 = pblendvb(auVar66,auVar36,auVar108);
              iVar18 = 6;
              do {
                auVar106._0_8_ = auVar38._0_8_ << 0x10;
                auVar106._8_8_ = auVar38._8_8_ << 0x10 | auVar38._0_8_ >> 0x30;
                auVar84._0_8_ = auVar83._0_8_ << 0x10;
                auVar84._8_8_ = auVar83._8_8_ << 0x10 | auVar83._0_8_ >> 0x30;
                auVar66 = paddsw(auVar84,auVar67);
                sVar32 = auVar83._0_2_;
                sVar49 = auVar66._0_2_;
                auVar40._0_2_ = -(ushort)(sVar49 < sVar32);
                sVar33 = auVar83._2_2_;
                sVar50 = auVar66._2_2_;
                auVar40._2_2_ = -(ushort)(sVar50 < sVar33);
                sVar43 = auVar83._4_2_;
                sVar51 = auVar66._4_2_;
                auVar40._4_2_ = -(ushort)(sVar51 < sVar43);
                sVar44 = auVar83._6_2_;
                sVar52 = auVar66._6_2_;
                auVar40._6_2_ = -(ushort)(sVar52 < sVar44);
                sVar45 = auVar83._8_2_;
                sVar53 = auVar66._8_2_;
                auVar40._8_2_ = -(ushort)(sVar53 < sVar45);
                sVar46 = auVar83._10_2_;
                sVar54 = auVar66._10_2_;
                auVar40._10_2_ = -(ushort)(sVar54 < sVar46);
                sVar47 = auVar83._12_2_;
                sVar55 = auVar66._12_2_;
                sVar48 = auVar83._14_2_;
                auVar40._12_2_ = -(ushort)(sVar55 < sVar47);
                sVar56 = auVar66._14_2_;
                auVar40._14_2_ = -(ushort)(sVar56 < sVar48);
                auVar38 = pblendvb(auVar106,auVar38,auVar40);
                auVar79._0_8_ = auVar37._0_8_ << 0x10;
                auVar79._8_8_ = auVar37._8_8_ << 0x10 | auVar37._0_8_ >> 0x30;
                auVar74._0_8_ = auVar36._0_8_ << 0x10;
                auVar74._8_8_ = auVar36._8_8_ << 0x10 | auVar36._0_8_ >> 0x30;
                auVar66 = paddsw(auVar74,auVar57);
                uVar110 = (ushort)(sVar52 < sVar44) * sVar44 | (ushort)(sVar52 >= sVar44) * sVar52;
                auVar83._0_8_ =
                     CONCAT26(uVar110,CONCAT24((ushort)(sVar51 < sVar43) * sVar43 |
                                               (ushort)(sVar51 >= sVar43) * sVar51,
                                               CONCAT22((ushort)(sVar50 < sVar33) * sVar33 |
                                                        (ushort)(sVar50 >= sVar33) * sVar50,
                                                        (ushort)(sVar49 < sVar32) * sVar32 |
                                                        (ushort)(sVar49 >= sVar32) * sVar49)));
                auVar83._8_2_ =
                     (ushort)(sVar53 < sVar45) * sVar45 | (ushort)(sVar53 >= sVar45) * sVar53;
                auVar83._10_2_ =
                     (ushort)(sVar54 < sVar46) * sVar46 | (ushort)(sVar54 >= sVar46) * sVar54;
                auVar83._12_2_ =
                     (ushort)(sVar55 < sVar47) * sVar47 | (ushort)(sVar55 >= sVar47) * sVar55;
                auVar83._14_2_ =
                     (ushort)(sVar56 < sVar48) * sVar48 | (ushort)(sVar56 >= sVar48) * sVar56;
                auVar37 = pblendvb(auVar79,auVar37,auVar40);
                auVar36 = pblendvb(auVar66,auVar36,auVar40);
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
              auVar75._0_8_ = auVar36._0_8_ << 0x10;
              auVar75._8_8_ = auVar36._8_8_ << 0x10 | auVar36._0_8_ >> 0x30;
              auVar80._0_8_ = auVar37._0_8_ << 0x10;
              auVar80._8_8_ = auVar37._8_8_ << 0x10 | auVar37._0_8_ >> 0x30;
              auVar107._0_8_ = auVar38._0_8_ << 0x10;
              auVar107._8_8_ = auVar38._8_8_ << 0x10 | auVar38._0_8_ >> 0x30;
              auVar85._0_8_ = auVar83._0_8_ << 0x10;
              auVar85._8_8_ = auVar83._8_8_ << 0x10 | (ulong)uVar110;
              auVar86 = paddsw(auVar85,ZEXT416(uVar13));
              sVar32 = auVar86._0_2_;
              auVar41._0_2_ = -(ushort)(0 < sVar32);
              sVar33 = auVar86._2_2_;
              auVar41._2_2_ = -(ushort)((short)uVar89 < sVar33);
              sVar43 = auVar86._4_2_;
              auVar41._4_2_ = -(ushort)((short)uVar91 < sVar43);
              sVar44 = auVar86._6_2_;
              auVar41._6_2_ = -(ushort)((short)uVar93 < sVar44);
              sVar45 = auVar86._8_2_;
              auVar41._8_2_ = -(ushort)((short)uVar95 < sVar45);
              sVar46 = auVar86._10_2_;
              auVar41._10_2_ = -(ushort)((short)auVar58._8_2_ < sVar46);
              sVar47 = auVar86._12_2_;
              sVar48 = auVar86._14_2_;
              auVar41._12_2_ = -(ushort)((short)auVar58._10_2_ < sVar47);
              auVar41._14_2_ = -(ushort)((short)auVar58._12_2_ < sVar48);
              auVar37 = pblendvb(local_158,auVar75,auVar41);
              auVar66 = pblendvb(local_168,auVar80,auVar41);
              auVar38 = pblendvb(local_178,auVar107,auVar41);
              auVar60._2_2_ =
                   (ushort)((short)uVar89 < sVar33) * sVar33 | ((short)uVar89 >= sVar33) * uVar89;
              auVar60._0_2_ = (ushort)(0 < sVar32) * sVar32;
              auVar60._4_2_ =
                   (ushort)((short)uVar91 < sVar43) * sVar43 | ((short)uVar91 >= sVar43) * uVar91;
              auVar60._6_2_ =
                   (ushort)((short)uVar93 < sVar44) * sVar44 | ((short)uVar93 >= sVar44) * uVar93;
              auVar60._8_2_ =
                   (ushort)((short)uVar95 < sVar45) * sVar45 | ((short)uVar95 >= sVar45) * uVar95;
              auVar60._10_2_ =
                   (ushort)((short)auVar58._8_2_ < sVar46) * sVar46 |
                   ((short)auVar58._8_2_ >= sVar46) * auVar58._8_2_;
              auVar60._12_2_ =
                   (ushort)((short)auVar58._10_2_ < sVar47) * sVar47 |
                   ((short)auVar58._10_2_ >= sVar47) * auVar58._10_2_;
              auVar60._14_2_ =
                   (ushort)((short)auVar58._12_2_ < sVar48) * sVar48 |
                   ((short)auVar58._12_2_ >= sVar48) * auVar58._12_2_;
              lVar25 = 0;
              auVar11._4_4_ = uVar34;
              auVar11._0_4_ = uVar34;
              auVar11._8_4_ = uVar34;
              auVar11._12_4_ = uVar34;
              lVar21 = local_1c8;
              auVar36 = auVar109;
              do {
                auVar73._4_4_ = uVar35;
                auVar73._0_4_ = uVar35;
                auVar73._8_4_ = uVar35;
                auVar73._12_4_ = uVar35;
                auVar61 = psubsw(auVar60,auVar11);
                auVar71 = psubsw(auVar86,auVar73);
                sVar32 = auVar61._0_2_;
                sVar49 = auVar71._0_2_;
                auVar62._0_2_ = -(ushort)(sVar49 < sVar32);
                sVar33 = auVar61._2_2_;
                sVar50 = auVar71._2_2_;
                auVar62._2_2_ = -(ushort)(sVar50 < sVar33);
                sVar43 = auVar61._4_2_;
                sVar51 = auVar71._4_2_;
                auVar62._4_2_ = -(ushort)(sVar51 < sVar43);
                sVar44 = auVar61._6_2_;
                sVar52 = auVar71._6_2_;
                auVar62._6_2_ = -(ushort)(sVar52 < sVar44);
                sVar45 = auVar61._8_2_;
                sVar53 = auVar71._8_2_;
                auVar62._8_2_ = -(ushort)(sVar53 < sVar45);
                sVar46 = auVar61._10_2_;
                sVar54 = auVar71._10_2_;
                auVar62._10_2_ = -(ushort)(sVar54 < sVar46);
                sVar47 = auVar61._12_2_;
                sVar55 = auVar71._12_2_;
                sVar48 = auVar61._14_2_;
                auVar62._12_2_ = -(ushort)(sVar55 < sVar47);
                sVar56 = auVar71._14_2_;
                auVar62._14_2_ = -(ushort)(sVar56 < sVar48);
                puVar1 = (ushort *)((long)*b_03 + lVar25);
                uVar89 = *puVar1;
                uVar91 = puVar1[1];
                uVar93 = puVar1[2];
                uVar95 = puVar1[3];
                uVar97 = puVar1[4];
                uVar99 = puVar1[5];
                uVar101 = puVar1[6];
                uVar103 = puVar1[7];
                auVar107 = pblendvb(auVar107,auVar38,auVar62);
                auVar86._0_2_ =
                     (ushort)(sVar32 < sVar49) * sVar49 | (ushort)(sVar32 >= sVar49) * sVar32;
                auVar86._2_2_ =
                     (ushort)(sVar33 < sVar50) * sVar50 | (ushort)(sVar33 >= sVar50) * sVar33;
                auVar86._4_2_ =
                     (ushort)(sVar43 < sVar51) * sVar51 | (ushort)(sVar43 >= sVar51) * sVar43;
                auVar86._6_2_ =
                     (ushort)(sVar44 < sVar52) * sVar52 | (ushort)(sVar44 >= sVar52) * sVar44;
                auVar86._8_2_ =
                     (ushort)(sVar45 < sVar53) * sVar53 | (ushort)(sVar45 >= sVar53) * sVar45;
                auVar86._10_2_ =
                     (ushort)(sVar46 < sVar54) * sVar54 | (ushort)(sVar46 >= sVar54) * sVar46;
                auVar86._12_2_ =
                     (ushort)(sVar47 < sVar55) * sVar55 | (ushort)(sVar47 >= sVar55) * sVar47;
                auVar86._14_2_ =
                     (ushort)(sVar48 < sVar56) * sVar56 | (ushort)(sVar48 >= sVar56) * sVar48;
                auVar80 = pblendvb(auVar80,auVar66,auVar62);
                psVar2 = (short *)((long)*b + lVar25);
                sVar32 = *psVar2;
                sVar33 = psVar2[1];
                sVar43 = psVar2[2];
                sVar44 = psVar2[3];
                sVar45 = psVar2[4];
                sVar46 = psVar2[5];
                sVar47 = psVar2[6];
                sVar48 = psVar2[7];
                auVar37 = pblendvb(auVar75,auVar37,auVar62);
                uVar110 = (sVar32 < (short)uVar89) * uVar89 |
                          (ushort)(sVar32 >= (short)uVar89) * sVar32;
                uVar114 = (sVar33 < (short)uVar91) * uVar91 |
                          (ushort)(sVar33 >= (short)uVar91) * sVar33;
                uVar116 = (sVar43 < (short)uVar93) * uVar93 |
                          (ushort)(sVar43 >= (short)uVar93) * sVar43;
                uVar118 = (sVar44 < (short)uVar95) * uVar95 |
                          (ushort)(sVar44 >= (short)uVar95) * sVar44;
                uVar120 = (sVar45 < (short)uVar97) * uVar97 |
                          (ushort)(sVar45 >= (short)uVar97) * sVar45;
                uVar122 = (sVar46 < (short)uVar99) * uVar99 |
                          (ushort)(sVar46 >= (short)uVar99) * sVar46;
                uVar124 = (sVar47 < (short)uVar101) * uVar101 |
                          (ushort)(sVar47 >= (short)uVar101) * sVar47;
                uVar65 = (sVar48 < (short)uVar103) * uVar103 |
                         (ushort)(sVar48 >= (short)uVar103) * sVar48;
                uVar112 = ((short)uVar110 < (short)auVar86._0_2_) * auVar86._0_2_ |
                          ((short)uVar110 >= (short)auVar86._0_2_) * uVar110;
                uVar110 = ((short)uVar114 < (short)auVar86._2_2_) * auVar86._2_2_ |
                          ((short)uVar114 >= (short)auVar86._2_2_) * uVar114;
                uVar114 = ((short)uVar116 < (short)auVar86._4_2_) * auVar86._4_2_ |
                          ((short)uVar116 >= (short)auVar86._4_2_) * uVar116;
                uVar116 = ((short)uVar118 < (short)auVar86._6_2_) * auVar86._6_2_ |
                          ((short)uVar118 >= (short)auVar86._6_2_) * uVar118;
                uVar118 = ((short)uVar120 < (short)auVar86._8_2_) * auVar86._8_2_ |
                          ((short)uVar120 >= (short)auVar86._8_2_) * uVar120;
                uVar120 = ((short)uVar122 < (short)auVar86._10_2_) * auVar86._10_2_ |
                          ((short)uVar122 >= (short)auVar86._10_2_) * uVar122;
                uVar122 = ((short)uVar124 < (short)auVar86._12_2_) * auVar86._12_2_ |
                          ((short)uVar124 >= (short)auVar86._12_2_) * uVar124;
                uVar124 = ((short)uVar65 < (short)auVar86._14_2_) * auVar86._14_2_ |
                          ((short)uVar65 >= (short)auVar86._14_2_) * uVar65;
                auVar61 = pmovsxbw(auVar38,0x101010101010101);
                auVar77._0_2_ = -(ushort)((short)uVar112 < auVar61._0_2_);
                auVar77._2_2_ = -(ushort)((short)uVar110 < auVar61._2_2_);
                auVar77._4_2_ = -(ushort)((short)uVar114 < auVar61._4_2_);
                auVar77._6_2_ = -(ushort)((short)uVar116 < auVar61._6_2_);
                auVar77._8_2_ = -(ushort)((short)uVar118 < auVar61._8_2_);
                auVar77._10_2_ = -(ushort)((short)uVar120 < auVar61._10_2_);
                auVar77._12_2_ = -(ushort)((short)uVar122 < auVar61._12_2_);
                auVar77._14_2_ = -(ushort)((short)uVar124 < auVar61._14_2_);
                uVar112 = (-1 < (short)uVar112) * uVar112;
                uVar110 = (-1 < (short)uVar110) * uVar110;
                auVar60._2_2_ = uVar110;
                auVar60._0_2_ = uVar112;
                uVar114 = (-1 < (short)uVar114) * uVar114;
                auVar60._4_2_ = uVar114;
                uVar116 = (-1 < (short)uVar116) * uVar116;
                auVar60._6_2_ = uVar116;
                uVar118 = (-1 < (short)uVar118) * uVar118;
                auVar60._8_2_ = uVar118;
                uVar120 = (-1 < (short)uVar120) * uVar120;
                auVar60._10_2_ = uVar120;
                uVar122 = (-1 < (short)uVar122) * uVar122;
                auVar60._12_2_ = uVar122;
                uVar124 = (-1 < (short)uVar124) * uVar124;
                auVar60._14_2_ = uVar124;
                auVar69._0_2_ = -(ushort)(uVar89 == uVar112);
                auVar69._2_2_ = -(ushort)(uVar91 == uVar110);
                auVar69._4_2_ = -(ushort)(uVar93 == uVar114);
                auVar69._6_2_ = -(ushort)(uVar95 == uVar116);
                auVar69._8_2_ = -(ushort)(uVar97 == uVar118);
                auVar69._10_2_ = -(ushort)(uVar99 == uVar120);
                auVar69._12_2_ = -(ushort)(uVar101 == uVar122);
                auVar69._14_2_ = -(ushort)(uVar103 == uVar124);
                auVar72._0_2_ = -(ushort)(uVar112 == auVar86._0_2_);
                auVar72._2_2_ = -(ushort)(uVar110 == auVar86._2_2_);
                auVar72._4_2_ = -(ushort)(uVar114 == auVar86._4_2_);
                auVar72._6_2_ = -(ushort)(uVar116 == auVar86._6_2_);
                auVar72._8_2_ = -(ushort)(uVar118 == auVar86._8_2_);
                auVar72._10_2_ = -(ushort)(uVar120 == auVar86._10_2_);
                auVar72._12_2_ = -(ushort)(uVar122 == auVar86._12_2_);
                auVar72._14_2_ = -(ushort)(uVar124 == auVar86._14_2_);
                auVar66 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar25),auVar107,auVar72);
                auVar38 = pblendvb(auVar66,*(undefined1 (*) [16])((long)*b_04 + lVar25),auVar69);
                auVar66 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar25),auVar80,auVar72);
                auVar66 = pblendvb(auVar66,*(undefined1 (*) [16])((long)*b_05 + lVar25),auVar69);
                auVar75 = paddsw(auVar37,auVar61);
                auVar37 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar25),auVar75,auVar72);
                auVar37 = pblendvb(auVar37,*(undefined1 (*) [16])((long)*b_06 + lVar25),auVar69);
                auVar38 = ~auVar77 & auVar38;
                auVar66 = ~auVar77 & auVar66;
                auVar37 = ~auVar77 & auVar37;
                sVar32 = auVar111._0_2_;
                uVar89 = (sVar32 < (short)uVar112) * uVar112 |
                         (ushort)(sVar32 >= (short)uVar112) * sVar32;
                sVar32 = auVar111._2_2_;
                uVar91 = (sVar32 < (short)uVar110) * uVar110 |
                         (ushort)(sVar32 >= (short)uVar110) * sVar32;
                sVar32 = auVar111._4_2_;
                uVar93 = (sVar32 < (short)uVar114) * uVar114 |
                         (ushort)(sVar32 >= (short)uVar114) * sVar32;
                sVar32 = auVar111._6_2_;
                uVar95 = (sVar32 < (short)uVar116) * uVar116 |
                         (ushort)(sVar32 >= (short)uVar116) * sVar32;
                sVar32 = auVar111._8_2_;
                uVar97 = (sVar32 < (short)uVar118) * uVar118 |
                         (ushort)(sVar32 >= (short)uVar118) * sVar32;
                sVar32 = auVar111._10_2_;
                uVar99 = (sVar32 < (short)uVar120) * uVar120 |
                         (ushort)(sVar32 >= (short)uVar120) * sVar32;
                sVar32 = auVar111._12_2_;
                sVar33 = auVar111._14_2_;
                uVar101 = (sVar32 < (short)uVar122) * uVar122 |
                          (ushort)(sVar32 >= (short)uVar122) * sVar32;
                uVar103 = (sVar33 < (short)uVar124) * uVar124 |
                          (ushort)(sVar33 >= (short)uVar124) * sVar33;
                sVar32 = auVar38._0_2_;
                uVar89 = (ushort)((short)uVar89 < sVar32) * sVar32 |
                         ((short)uVar89 >= sVar32) * uVar89;
                sVar43 = auVar38._2_2_;
                uVar91 = (ushort)((short)uVar91 < sVar43) * sVar43 |
                         ((short)uVar91 >= sVar43) * uVar91;
                sVar45 = auVar38._4_2_;
                uVar93 = (ushort)((short)uVar93 < sVar45) * sVar45 |
                         ((short)uVar93 >= sVar45) * uVar93;
                sVar47 = auVar38._6_2_;
                uVar95 = (ushort)((short)uVar95 < sVar47) * sVar47 |
                         ((short)uVar95 >= sVar47) * uVar95;
                sVar49 = auVar38._8_2_;
                uVar97 = (ushort)((short)uVar97 < sVar49) * sVar49 |
                         ((short)uVar97 >= sVar49) * uVar97;
                sVar51 = auVar38._10_2_;
                uVar99 = (ushort)((short)uVar99 < sVar51) * sVar51 |
                         ((short)uVar99 >= sVar51) * uVar99;
                sVar53 = auVar38._12_2_;
                uVar101 = (ushort)((short)uVar101 < sVar53) * sVar53 |
                          ((short)uVar101 >= sVar53) * uVar101;
                sVar55 = auVar38._14_2_;
                uVar103 = (ushort)((short)uVar103 < sVar55) * sVar55 |
                          ((short)uVar103 >= sVar55) * uVar103;
                sVar33 = auVar37._0_2_;
                sVar88 = auVar66._0_2_;
                uVar65 = (ushort)(sVar88 < sVar33) * sVar33 | (ushort)(sVar88 >= sVar33) * sVar88;
                sVar44 = auVar37._2_2_;
                sVar90 = auVar66._2_2_;
                uVar113 = (ushort)(sVar90 < sVar44) * sVar44 | (ushort)(sVar90 >= sVar44) * sVar90;
                sVar46 = auVar37._4_2_;
                sVar92 = auVar66._4_2_;
                uVar115 = (ushort)(sVar92 < sVar46) * sVar46 | (ushort)(sVar92 >= sVar46) * sVar92;
                sVar48 = auVar37._6_2_;
                sVar94 = auVar66._6_2_;
                uVar117 = (ushort)(sVar94 < sVar48) * sVar48 | (ushort)(sVar94 >= sVar48) * sVar94;
                sVar50 = auVar37._8_2_;
                sVar96 = auVar66._8_2_;
                uVar119 = (ushort)(sVar96 < sVar50) * sVar50 | (ushort)(sVar96 >= sVar50) * sVar96;
                sVar52 = auVar37._10_2_;
                sVar98 = auVar66._10_2_;
                uVar121 = (ushort)(sVar98 < sVar52) * sVar52 | (ushort)(sVar98 >= sVar52) * sVar98;
                sVar54 = auVar37._12_2_;
                sVar100 = auVar66._12_2_;
                sVar102 = auVar66._14_2_;
                uVar123 = (ushort)(sVar100 < sVar54) * sVar54 |
                          (ushort)(sVar100 >= sVar54) * sVar100;
                sVar56 = auVar37._14_2_;
                uVar125 = (ushort)(sVar102 < sVar56) * sVar56 |
                          (ushort)(sVar102 >= sVar56) * sVar102;
                auVar111._0_2_ =
                     ((short)uVar65 < (short)uVar89) * uVar89 |
                     ((short)uVar65 >= (short)uVar89) * uVar65;
                auVar111._2_2_ =
                     ((short)uVar113 < (short)uVar91) * uVar91 |
                     ((short)uVar113 >= (short)uVar91) * uVar113;
                auVar111._4_2_ =
                     ((short)uVar115 < (short)uVar93) * uVar93 |
                     ((short)uVar115 >= (short)uVar93) * uVar115;
                auVar111._6_2_ =
                     ((short)uVar117 < (short)uVar95) * uVar95 |
                     ((short)uVar117 >= (short)uVar95) * uVar117;
                auVar111._8_2_ =
                     ((short)uVar119 < (short)uVar97) * uVar97 |
                     ((short)uVar119 >= (short)uVar97) * uVar119;
                auVar111._10_2_ =
                     ((short)uVar121 < (short)uVar99) * uVar99 |
                     ((short)uVar121 >= (short)uVar99) * uVar121;
                auVar111._12_2_ =
                     ((short)uVar123 < (short)uVar101) * uVar101 |
                     ((short)uVar123 >= (short)uVar101) * uVar123;
                auVar111._14_2_ =
                     ((short)uVar125 < (short)uVar103) * uVar103 |
                     ((short)uVar125 >= (short)uVar103) * uVar125;
                *(undefined1 (*) [16])((long)*b_03 + lVar25) = auVar60;
                *(undefined1 (*) [16])((long)*b_04 + lVar25) = auVar38;
                *(undefined1 (*) [16])((long)*b_05 + lVar25) = auVar66;
                *(undefined1 (*) [16])((long)*b_06 + lVar25) = auVar37;
                lVar24 = *((ppVar16->field_4).trace)->trace_del_table;
                *(uint *)(lVar24 + lVar21) = (uint)uVar112;
                lVar24 = lVar24 + lVar21;
                *(uint *)(lVar19 + lVar24) = (uint)uVar110;
                *(uint *)(lVar3 + lVar24) = (uint)uVar114;
                *(uint *)(lVar8 + lVar24) = (uint)uVar116;
                *(uint *)(lVar31 + lVar24) = (uint)uVar118;
                *(uint *)(lVar9 + lVar24) = (uint)uVar120;
                *(uint *)(lVar30 + lVar24) = (uint)uVar122;
                *(uint *)(lVar10 + lVar24) = (uint)uVar124;
                lVar24 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 8);
                *(int *)(lVar24 + lVar21) = (int)sVar32;
                lVar24 = lVar24 + lVar21;
                *(int *)(lVar19 + lVar24) = (int)sVar43;
                *(int *)(lVar3 + lVar24) = (int)sVar45;
                *(int *)(lVar8 + lVar24) = (int)sVar47;
                *(int *)(lVar31 + lVar24) = (int)sVar49;
                *(int *)(lVar9 + lVar24) = (int)sVar51;
                *(int *)(lVar30 + lVar24) = (int)sVar53;
                *(int *)(lVar10 + lVar24) = (int)sVar55;
                lVar24 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x10);
                *(int *)(lVar24 + lVar21) = (int)sVar88;
                lVar24 = lVar24 + lVar21;
                *(int *)(lVar19 + lVar24) = (int)sVar90;
                *(int *)(lVar3 + lVar24) = (int)sVar92;
                *(int *)(lVar8 + lVar24) = (int)sVar94;
                *(int *)(lVar31 + lVar24) = (int)sVar96;
                *(int *)(lVar9 + lVar24) = (int)sVar98;
                *(int *)(lVar30 + lVar24) = (int)sVar100;
                *(int *)(lVar10 + lVar24) = (int)sVar102;
                lVar24 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x18);
                *(int *)(lVar24 + lVar21) = (int)sVar33;
                lVar24 = lVar24 + lVar21;
                *(int *)(lVar19 + lVar24) = (int)sVar44;
                *(int *)(lVar3 + lVar24) = (int)sVar46;
                *(int *)(lVar8 + lVar24) = (int)sVar48;
                *(int *)(lVar31 + lVar24) = (int)sVar50;
                *(int *)(lVar9 + lVar24) = (int)sVar52;
                *(int *)(lVar30 + lVar24) = (int)sVar54;
                *(int *)(lVar10 + lVar24) = (int)sVar56;
                local_248._0_2_ =
                     ((short)uVar112 < (short)(ushort)local_248) * uVar112 |
                     ((short)uVar112 >= (short)(ushort)local_248) * (ushort)local_248;
                local_248._2_2_ =
                     ((short)uVar110 < (short)local_248._2_2_) * uVar110 |
                     ((short)uVar110 >= (short)local_248._2_2_) * local_248._2_2_;
                local_248._4_2_ =
                     ((short)uVar114 < (short)local_248._4_2_) * uVar114 |
                     ((short)uVar114 >= (short)local_248._4_2_) * local_248._4_2_;
                local_248._6_2_ =
                     ((short)uVar116 < (short)local_248._6_2_) * uVar116 |
                     ((short)uVar116 >= (short)local_248._6_2_) * local_248._6_2_;
                uStack_240._0_2_ =
                     ((short)uVar118 < (short)(ushort)uStack_240) * uVar118 |
                     ((short)uVar118 >= (short)(ushort)uStack_240) * (ushort)uStack_240;
                uStack_240._2_2_ =
                     ((short)uVar120 < (short)uStack_240._2_2_) * uVar120 |
                     ((short)uVar120 >= (short)uStack_240._2_2_) * uStack_240._2_2_;
                uStack_240._4_2_ =
                     ((short)uVar122 < (short)uStack_240._4_2_) * uVar122 |
                     ((short)uVar122 >= (short)uStack_240._4_2_) * uStack_240._4_2_;
                uStack_240._6_2_ =
                     ((short)uVar124 < (short)uStack_240._6_2_) * uVar124 |
                     ((short)uVar124 >= (short)uStack_240._6_2_) * uStack_240._6_2_;
                sVar32 = auVar36._0_2_;
                auVar109._0_2_ =
                     (sVar32 < (short)uVar112) * uVar112 |
                     (ushort)(sVar32 >= (short)uVar112) * sVar32;
                sVar32 = auVar36._2_2_;
                auVar109._2_2_ =
                     (sVar32 < (short)uVar110) * uVar110 |
                     (ushort)(sVar32 >= (short)uVar110) * sVar32;
                sVar32 = auVar36._4_2_;
                auVar109._4_2_ =
                     (sVar32 < (short)uVar114) * uVar114 |
                     (ushort)(sVar32 >= (short)uVar114) * sVar32;
                sVar32 = auVar36._6_2_;
                auVar109._6_2_ =
                     (sVar32 < (short)uVar116) * uVar116 |
                     (ushort)(sVar32 >= (short)uVar116) * sVar32;
                sVar32 = auVar36._8_2_;
                auVar109._8_2_ =
                     (sVar32 < (short)uVar118) * uVar118 |
                     (ushort)(sVar32 >= (short)uVar118) * sVar32;
                sVar32 = auVar36._10_2_;
                auVar109._10_2_ =
                     (sVar32 < (short)uVar120) * uVar120 |
                     (ushort)(sVar32 >= (short)uVar120) * sVar32;
                sVar32 = auVar36._12_2_;
                sVar33 = auVar36._14_2_;
                auVar109._12_2_ =
                     (sVar32 < (short)uVar122) * uVar122 |
                     (ushort)(sVar32 >= (short)uVar122) * sVar32;
                auVar109._14_2_ =
                     (sVar33 < (short)uVar124) * uVar124 |
                     (ushort)(sVar33 >= (short)uVar124) * sVar33;
                lVar25 = lVar25 + 0x10;
                lVar21 = lVar21 + uVar17 * 4;
                auVar36 = auVar109;
              } while (lVar20 != lVar25);
              auVar42._0_2_ = -(ushort)((short)local_98._0_2_ < (short)auVar109._0_2_);
              auVar42._2_2_ = -(ushort)((short)local_98._2_2_ < (short)auVar109._2_2_);
              auVar42._4_2_ = -(ushort)((short)local_98._4_2_ < (short)auVar109._4_2_);
              auVar42._6_2_ = -(ushort)((short)local_98._6_2_ < (short)auVar109._6_2_);
              auVar42._8_2_ = -(ushort)((short)local_98._8_2_ < (short)auVar109._8_2_);
              auVar42._10_2_ = -(ushort)((short)local_98._10_2_ < (short)auVar109._10_2_);
              auVar42._12_2_ = -(ushort)((short)local_98._12_2_ < (short)auVar109._12_2_);
              auVar42._14_2_ = -(ushort)((short)local_98._14_2_ < (short)auVar109._14_2_);
              if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar42 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar42 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar42 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar42 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar42 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar42 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar42 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar42._14_2_ >> 7 & 1) != 0) || (auVar42._14_2_ & 0x8000) != 0) {
                uVar110 = ((short)auVar109._8_2_ < (short)auVar109._0_2_) * auVar109._0_2_ |
                          ((short)auVar109._8_2_ >= (short)auVar109._0_2_) * auVar109._8_2_;
                uVar112 = ((short)auVar109._10_2_ < (short)auVar109._2_2_) * auVar109._2_2_ |
                          ((short)auVar109._10_2_ >= (short)auVar109._2_2_) * auVar109._10_2_;
                uVar114 = ((short)auVar109._12_2_ < (short)auVar109._4_2_) * auVar109._4_2_ |
                          ((short)auVar109._12_2_ >= (short)auVar109._4_2_) * auVar109._12_2_;
                uVar116 = ((short)auVar109._14_2_ < (short)auVar109._6_2_) * auVar109._6_2_ |
                          ((short)auVar109._14_2_ >= (short)auVar109._6_2_) * auVar109._14_2_;
                sVar43 = (0 < (short)auVar109._8_2_) * auVar109._8_2_;
                sVar33 = (0 < (short)auVar109._10_2_) * auVar109._10_2_;
                sVar32 = (0 < (short)auVar109._12_2_) * auVar109._12_2_;
                sVar44 = (0 < (short)auVar109._14_2_) * auVar109._14_2_;
                auVar63._0_8_ =
                     CONCAT26((sVar33 < (short)uVar116) * uVar116 |
                              (ushort)(sVar33 >= (short)uVar116) * sVar33,
                              CONCAT24((sVar43 < (short)uVar114) * uVar114 |
                                       (ushort)(sVar43 >= (short)uVar114) * sVar43,
                                       CONCAT22(((short)uVar116 < (short)uVar112) * uVar112 |
                                                ((short)uVar116 >= (short)uVar112) * uVar116,
                                                ((short)uVar114 < (short)uVar110) * uVar110 |
                                                ((short)uVar114 >= (short)uVar110) * uVar114)));
                auVar63._8_2_ =
                     (ushort)(sVar32 < sVar43) * sVar43 | (ushort)(sVar32 >= sVar43) * sVar32;
                auVar63._10_2_ =
                     (ushort)(sVar44 < sVar33) * sVar33 | (ushort)(sVar44 >= sVar33) * sVar44;
                auVar63._12_2_ = (ushort)(0 < sVar32) * sVar32;
                auVar63._14_2_ = (ushort)(0 < sVar44) * sVar44;
                auVar36 = phminposuw(auVar109 ^ _DAT_00905510);
                local_2b4 = auVar36._0_4_ ^ 0x7fff;
                auVar36 = pshuflw(auVar36,auVar63,0);
                auVar64._0_8_ = auVar63._0_8_ >> 0x10;
                auVar64._8_8_ = auVar63._8_8_ >> 0x10;
                auVar66 = pshuflw(auVar64,auVar64,0);
                sVar32 = auVar36._0_2_;
                sVar43 = auVar66._0_2_;
                sVar33 = auVar36._2_2_;
                sVar44 = auVar66._2_2_;
                local_98._4_4_ =
                     CONCAT22((ushort)(sVar44 < sVar33) * sVar33 |
                              (ushort)(sVar44 >= sVar33) * sVar44,
                              (ushort)(sVar43 < sVar32) * sVar32 |
                              (ushort)(sVar43 >= sVar32) * sVar43);
                local_98._0_4_ = local_98._4_4_;
                local_98._8_4_ = local_98._4_4_;
                local_98._12_4_ = local_98._4_4_;
                memcpy(__dest,b_03,__n);
                memcpy(__dest_00,b_04,__n);
                memcpy(__dest_01,b_05,__n);
                memcpy(__dest_02,b_06,__n);
                local_26c = (int)uVar28;
              }
              uVar28 = uVar28 + 1;
              local_1c8 = local_1c8 + 4;
            } while (uVar28 != uVar17);
            sVar32 = (short)local_2b4;
            if ((uVar26 & 0x7ffffff8) == 0) {
              sVar33 = 0;
              sVar43 = 0;
              sVar44 = 0;
            }
            else {
              uVar26 = 0;
              sVar44 = 0;
              sVar43 = 0;
              sVar33 = 0;
              do {
                if ((*(short *)((long)*__dest + uVar26 * 2) == sVar32) &&
                   (uVar27 = ((uint)uVar26 & 7) * uVar29 + ((uint)(uVar26 >> 3) & 0x1fffffff),
                   (int)uVar27 < (int)uVar15)) {
                  sVar33 = *(short *)((long)*__dest_00 + uVar26 * 2);
                  sVar43 = *(short *)((long)*__dest_01 + uVar26 * 2);
                  sVar44 = *(short *)((long)*__dest_02 + uVar26 * 2);
                  uVar15 = (ulong)uVar27;
                }
                uVar27 = (uint)uVar15;
                uVar26 = uVar26 + 1;
              } while ((uVar29 & 0xfffffff) << 3 != (int)uVar26);
            }
            auVar57._0_2_ = -(ushort)((short)(ushort)local_248 < (short)local_1b8);
            auVar57._2_2_ = -(ushort)((short)local_248._2_2_ < (short)uStack_1b6);
            auVar57._4_2_ = -(ushort)((short)local_248._4_2_ < (short)local_1b8);
            auVar57._6_2_ = -(ushort)((short)local_248._6_2_ < (short)uStack_1b6);
            auVar57._8_2_ = -(ushort)((short)(ushort)uStack_240 < (short)local_1b8);
            auVar57._10_2_ = -(ushort)((short)uStack_240._2_2_ < (short)uStack_1b6);
            auVar57._12_2_ = -(ushort)((short)uStack_240._4_2_ < (short)local_1b8);
            auVar57._14_2_ = -(ushort)((short)uStack_240._6_2_ < (short)uStack_1b6);
            auVar67._0_2_ = -(ushort)(local_a8 < (short)auVar111._0_2_);
            auVar67._2_2_ = -(ushort)(sStack_a6 < (short)auVar111._2_2_);
            auVar67._4_2_ = -(ushort)(local_a8 < (short)auVar111._4_2_);
            auVar67._6_2_ = -(ushort)(sStack_a6 < (short)auVar111._6_2_);
            auVar67._8_2_ = -(ushort)(local_a8 < (short)auVar111._8_2_);
            auVar67._10_2_ = -(ushort)(sStack_a6 < (short)auVar111._10_2_);
            auVar67._12_2_ = -(ushort)(local_a8 < (short)auVar111._12_2_);
            auVar67._14_2_ = -(ushort)(sStack_a6 < (short)auVar111._14_2_);
            auVar67 = auVar67 | auVar57;
            if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar67 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar67 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar67 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar67 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar67 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar67 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar67 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar67 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar67 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar67 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar67 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar67[0xf] < '\0') {
              *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
              sVar32 = 0;
              sVar33 = 0;
              sVar43 = 0;
              sVar44 = 0;
              local_26c = 0;
              uVar27 = 0;
            }
            ppVar16->score = (int)sVar32;
            ppVar16->end_query = uVar27;
            ppVar16->end_ref = local_26c;
            *(int *)(ppVar16->field_4).extra = (int)sVar33;
            ((ppVar16->field_4).stats)->similar = (int)sVar43;
            ((ppVar16->field_4).stats)->length = (int)sVar44;
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(__dest_02);
            parasail_free(__dest_01);
            parasail_free(__dest_00);
            parasail_free(__dest);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(b_01);
            parasail_free(b_00);
            parasail_free(b);
            return ppVar16;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i case0;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            vH = _mm_max_epi16(vH, vZero);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            case0 = _mm_cmpeq_epi16(vH, vZero);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm_blendv_epi8(vHM, vZero, case0);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm_blendv_epi8(vHS, vZero, case0);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm_blendv_epi8(vHL, vZero, case0);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m128i cond_max = _mm_cmpgt_epi16(vH, vMaxH);
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m128i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m128i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            __m128i vHM = _mm_load_si128(pvHM + offset);
            __m128i vHS = _mm_load_si128(pvHS + offset);
            __m128i vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int16_t *m = (int16_t*)pvHMMax;
        int16_t *s = (int16_t*)pvHSMax;
        int16_t *l = (int16_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}